

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O3

int mg_check_digest_access_authentication(mg_connection *conn,char *realm,char *filename)

{
  int iVar1;
  undefined7 in_register_00000009;
  mg_file file;
  mg_file local_48;
  
  local_48.stat.is_directory = 0;
  local_48.stat.is_gzipped = 0;
  local_48.stat.location = 0;
  local_48.stat._28_4_ = 0;
  local_48.stat.size = 0;
  local_48.stat.last_modified = 0;
  local_48.access.fp = (FILE *)0x0;
  iVar1 = -1;
  if (filename != (char *)0x0 && conn != (mg_connection *)0x0) {
    iVar1 = mg_fopen((mg_connection *)filename,(char *)0x1,(int)&local_48,
                     (mg_file *)
                     CONCAT71(in_register_00000009,
                              filename == (char *)0x0 || conn == (mg_connection *)0x0));
    if (iVar1 == 0) {
      iVar1 = -2;
    }
    else {
      iVar1 = authorize(conn,&local_48,realm);
      if ((FILE *)local_48.access.fp != (FILE *)0x0) {
        fclose((FILE *)local_48.access.fp);
      }
    }
  }
  return iVar1;
}

Assistant:

CIVETWEB_API int
mg_check_digest_access_authentication(struct mg_connection *conn,
                                      const char *realm,
                                      const char *filename)
{
	struct mg_file file = STRUCT_FILE_INITIALIZER;
	int auth;

	if (!conn || !filename) {
		return -1;
	}
	if (!mg_fopen(conn, filename, MG_FOPEN_MODE_READ, &file)) {
		return -2;
	}

	auth = authorize(conn, &file, realm);

	mg_fclose(&file.access);

	return auth;
}